

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O3

CrispyValue std_len(CrispyValue *value,Vm *vm)

{
  Object *pOVar1;
  ObjString *object;
  object_t *poVar2;
  CrispyValue CVar3;
  
  if (value->type == OBJECT) {
    pOVar1 = (value->field_1).o_value;
    if (pOVar1->type == OBJ_STRING) {
      poVar2 = *(object_t **)(pOVar1 + 1);
    }
    else {
      if (pOVar1->type != OBJ_LIST) goto LAB_00108304;
      poVar2 = pOVar1[1].next;
    }
    CVar3 = create_number(((double)CONCAT44(0x45300000,(int)((ulong)poVar2 >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)poVar2) - 4503599627370496.0));
    return CVar3;
  }
LAB_00108304:
  vm->err_flag = true;
  object = new_string(vm,"Value has no length",0x13);
  CVar3 = create_object(&object->object);
  return CVar3;
}

Assistant:

CrispyValue std_len(CrispyValue *value, Vm *vm) {
    if (value->type != OBJECT) {
        vm->err_flag = true;
        // TODO include type
        return create_object((Object *) new_string(vm, "Value has no length", 19));
    }

    Object *obj = value->o_value;

    switch (obj->type) {
        case OBJ_LIST:
            return create_number(((ObjList *) obj)->content.count);
        case OBJ_STRING:
            return create_number(((ObjString *) obj)->length);
        default:
            vm->err_flag = true;
            // TODO include type
            return create_object((Object *) new_string(vm, "Value has no length", 19));
    }
}